

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,1,3,false>,Eigen::internal::assign_op<double,double>>
               (Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst,
               Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *src,
               assign_op<double,_double> *func)

{
  undefined8 func_00;
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false> *src_local;
  Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *dst_local;
  
  srcEvaluator.super_block_evaluator<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  ._16_8_ = func;
  evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_> *)
             local_38,src);
  resize_if_allowed<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,1,3,false>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_block_evaluator<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>
                     .
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                     ._16_8_);
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::evaluator
            ((evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
            ._16_8_;
  dstExpr = EigenBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::const_cast_derived
                      ((EigenBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_70);
  evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::~evaluator
            ((evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1,_3,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1,_3,_false>_> *)
             local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}